

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

void __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Object
          (Object<(anonymous_namespace)::ObjectStruct> *this,
          Object<(anonymous_namespace)::ObjectStruct> *param_1)

{
  pointer pMVar1;
  _Manager_type p_Var2;
  char *pcVar3;
  _Invoker_type p_Var4;
  pointer pMVar5;
  pointer pMVar6;
  long lVar7;
  
  lVar7 = (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar5 = std::
           _Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ::_M_allocate((_Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                          *)((lVar7 >> 3) * 0x6db6db6db6db6db7),(size_t)param_1);
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar5;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar7 + (long)pMVar5);
  pMVar1 = (param_1->Members).
           super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar6 = (param_1->Members).
                super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar6 != pMVar1; pMVar6 = pMVar6 + 1) {
    pcVar3 = (pMVar6->Name)._M_str;
    (pMVar5->Name)._M_len = (pMVar6->Name)._M_len;
    (pMVar5->Name)._M_str = pcVar3;
    *(undefined8 *)&(pMVar5->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar5->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar5->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar5->Function)._M_invoker = (_Invoker_type)0x0;
    p_Var2 = (pMVar6->Function).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&pMVar5->Function,(_Any_data *)&pMVar6->Function,__clone_functor);
      p_Var4 = (pMVar6->Function)._M_invoker;
      (pMVar5->Function).super__Function_base._M_manager =
           (pMVar6->Function).super__Function_base._M_manager;
      (pMVar5->Function)._M_invoker = p_Var4;
    }
    pMVar5->Required = pMVar6->Required;
    pMVar5 = pMVar5 + 1;
  }
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
  this->AnyRequired = param_1->AnyRequired;
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&this->Error,&param_1->Error);
  this->AllowExtra = param_1->AllowExtra;
  return;
}

Assistant:

Object(JsonErrors::ObjectErrorGenerator error = JsonErrors::INVALID_OBJECT,
           bool allowExtra = true)
      : Error(std::move(error))
      , AllowExtra(allowExtra)
    {
    }